

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfa.h
# Opt level: O0

void spvtools::CFA<spvtools::opt::DominatorTreeNode>::DepthFirstTraversal
               (DominatorTreeNode *entry,get_blocks_func *successor_func,
               function<void_(const_spvtools::opt::DominatorTreeNode_*)> *preorder,
               function<void_(const_spvtools::opt::DominatorTreeNode_*)> *postorder,
               function<void_(const_spvtools::opt::DominatorTreeNode_*,_const_spvtools::opt::DominatorTreeNode_*)>
               *backedge,function<bool_(const_spvtools::opt::DominatorTreeNode_*)> *terminal)

{
  bool bVar1;
  uint32_t id;
  vector<spvtools::opt::DominatorTreeNode_*,_std::allocator<spvtools::opt::DominatorTreeNode_*>_>
  *pvVar2;
  bb_iter *__lhs;
  reference ppDVar3;
  size_type sVar4;
  pair<std::__detail::_Node_iterator<unsigned_int,_true,_false>,_bool> pVar5;
  bool local_13c;
  uint32_t local_ec;
  block_info local_e8;
  uint32_t local_d4;
  DominatorTreeNode **local_d0;
  DominatorTreeNode *local_c8;
  DominatorTreeNode *child;
  reference local_b8;
  block_info *top;
  undefined1 local_a8;
  uint32_t local_9c;
  value_type local_98;
  undefined1 local_88 [8];
  vector<spvtools::CFA<spvtools::opt::DominatorTreeNode>::block_info,_std::allocator<spvtools::CFA<spvtools::opt::DominatorTreeNode>::block_info>_>
  work_list;
  unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
  processed;
  function<bool_(const_spvtools::opt::DominatorTreeNode_*)> *terminal_local;
  function<void_(const_spvtools::opt::DominatorTreeNode_*,_const_spvtools::opt::DominatorTreeNode_*)>
  *backedge_local;
  function<void_(const_spvtools::opt::DominatorTreeNode_*)> *postorder_local;
  function<void_(const_spvtools::opt::DominatorTreeNode_*)> *preorder_local;
  get_blocks_func *successor_func_local;
  DominatorTreeNode *entry_local;
  
  bVar1 = std::function::operator_cast_to_bool((function *)successor_func);
  if (!bVar1) {
    __assert_fail("successor_func && \"The successor function cannot be empty.\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/cfa.h"
                  ,0xb6,
                  "static void spvtools::CFA<spvtools::opt::DominatorTreeNode>::DepthFirstTraversal(const BB *, get_blocks_func, std::function<void (cbb_ptr)>, std::function<void (cbb_ptr)>, std::function<void (cbb_ptr, cbb_ptr)>, std::function<bool (cbb_ptr)>) [BB = spvtools::opt::DominatorTreeNode]"
                 );
  }
  bVar1 = std::function::operator_cast_to_bool((function *)preorder);
  if (!bVar1) {
    __assert_fail("preorder && \"The preorder function cannot be empty.\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/cfa.h"
                  ,0xb7,
                  "static void spvtools::CFA<spvtools::opt::DominatorTreeNode>::DepthFirstTraversal(const BB *, get_blocks_func, std::function<void (cbb_ptr)>, std::function<void (cbb_ptr)>, std::function<void (cbb_ptr, cbb_ptr)>, std::function<bool (cbb_ptr)>) [BB = spvtools::opt::DominatorTreeNode]"
                 );
  }
  bVar1 = std::function::operator_cast_to_bool((function *)postorder);
  if (!bVar1) {
    __assert_fail("postorder && \"The postorder function cannot be empty.\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/cfa.h"
                  ,0xb8,
                  "static void spvtools::CFA<spvtools::opt::DominatorTreeNode>::DepthFirstTraversal(const BB *, get_blocks_func, std::function<void (cbb_ptr)>, std::function<void (cbb_ptr)>, std::function<void (cbb_ptr, cbb_ptr)>, std::function<bool (cbb_ptr)>) [BB = spvtools::opt::DominatorTreeNode]"
                 );
  }
  bVar1 = std::function::operator_cast_to_bool((function *)terminal);
  if (bVar1) {
    std::
    unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
    ::unordered_set((unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                     *)&work_list.
                        super__Vector_base<spvtools::CFA<spvtools::opt::DominatorTreeNode>::block_info,_std::allocator<spvtools::CFA<spvtools::opt::DominatorTreeNode>::block_info>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage);
    std::
    vector<spvtools::CFA<spvtools::opt::DominatorTreeNode>::block_info,_std::allocator<spvtools::CFA<spvtools::opt::DominatorTreeNode>::block_info>_>
    ::vector((vector<spvtools::CFA<spvtools::opt::DominatorTreeNode>::block_info,_std::allocator<spvtools::CFA<spvtools::opt::DominatorTreeNode>::block_info>_>
              *)local_88);
    std::
    vector<spvtools::CFA<spvtools::opt::DominatorTreeNode>::block_info,_std::allocator<spvtools::CFA<spvtools::opt::DominatorTreeNode>::block_info>_>
    ::reserve((vector<spvtools::CFA<spvtools::opt::DominatorTreeNode>::block_info,_std::allocator<spvtools::CFA<spvtools::opt::DominatorTreeNode>::block_info>_>
               *)local_88,10);
    local_98.block = entry;
    pvVar2 = std::
             function<const_std::vector<spvtools::opt::DominatorTreeNode_*,_std::allocator<spvtools::opt::DominatorTreeNode_*>_>_*(const_spvtools::opt::DominatorTreeNode_*)>
             ::operator()(successor_func,entry);
    local_98.iter._M_current =
         (DominatorTreeNode **)
         std::
         begin<std::vector<spvtools::opt::DominatorTreeNode*,std::allocator<spvtools::opt::DominatorTreeNode*>>>
                   (pvVar2);
    std::
    vector<spvtools::CFA<spvtools::opt::DominatorTreeNode>::block_info,_std::allocator<spvtools::CFA<spvtools::opt::DominatorTreeNode>::block_info>_>
    ::push_back((vector<spvtools::CFA<spvtools::opt::DominatorTreeNode>::block_info,_std::allocator<spvtools::CFA<spvtools::opt::DominatorTreeNode>::block_info>_>
                 *)local_88,&local_98);
    std::function<void_(const_spvtools::opt::DominatorTreeNode_*)>::operator()(preorder,entry);
    local_9c = opt::DominatorTreeNode::id(entry);
    pVar5 = std::
            unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
            ::insert((unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                      *)&work_list.
                         super__Vector_base<spvtools::CFA<spvtools::opt::DominatorTreeNode>::block_info,_std::allocator<spvtools::CFA<spvtools::opt::DominatorTreeNode>::block_info>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage,&local_9c);
    top = (block_info *)pVar5.first.super__Node_iterator_base<unsigned_int,_false>._M_cur;
    local_a8 = pVar5.second;
    while (bVar1 = std::
                   vector<spvtools::CFA<spvtools::opt::DominatorTreeNode>::block_info,_std::allocator<spvtools::CFA<spvtools::opt::DominatorTreeNode>::block_info>_>
                   ::empty((vector<spvtools::CFA<spvtools::opt::DominatorTreeNode>::block_info,_std::allocator<spvtools::CFA<spvtools::opt::DominatorTreeNode>::block_info>_>
                            *)local_88), ((bVar1 ^ 0xffU) & 1) != 0) {
      local_b8 = std::
                 vector<spvtools::CFA<spvtools::opt::DominatorTreeNode>::block_info,_std::allocator<spvtools::CFA<spvtools::opt::DominatorTreeNode>::block_info>_>
                 ::back((vector<spvtools::CFA<spvtools::opt::DominatorTreeNode>::block_info,_std::allocator<spvtools::CFA<spvtools::opt::DominatorTreeNode>::block_info>_>
                         *)local_88);
      bVar1 = std::function<bool_(const_spvtools::opt::DominatorTreeNode_*)>::operator()
                        (terminal,local_b8->block);
      local_13c = true;
      if (!bVar1) {
        __lhs = &local_b8->iter;
        pvVar2 = std::
                 function<const_std::vector<spvtools::opt::DominatorTreeNode_*,_std::allocator<spvtools::opt::DominatorTreeNode_*>_>_*(const_spvtools::opt::DominatorTreeNode_*)>
                 ::operator()(successor_func,local_b8->block);
        child = (DominatorTreeNode *)
                std::
                end<std::vector<spvtools::opt::DominatorTreeNode*,std::allocator<spvtools::opt::DominatorTreeNode*>>>
                          (pvVar2);
        local_13c = __gnu_cxx::operator==
                              (__lhs,(__normal_iterator<spvtools::opt::DominatorTreeNode_*const_*,_std::vector<spvtools::opt::DominatorTreeNode_*,_std::allocator<spvtools::opt::DominatorTreeNode_*>_>_>
                                      *)&child);
      }
      if (local_13c == false) {
        ppDVar3 = __gnu_cxx::
                  __normal_iterator<spvtools::opt::DominatorTreeNode_*const_*,_std::vector<spvtools::opt::DominatorTreeNode_*,_std::allocator<spvtools::opt::DominatorTreeNode_*>_>_>
                  ::operator*(&local_b8->iter);
        local_c8 = *ppDVar3;
        local_d0 = (DominatorTreeNode **)
                   __gnu_cxx::
                   __normal_iterator<spvtools::opt::DominatorTreeNode_*const_*,_std::vector<spvtools::opt::DominatorTreeNode_*,_std::allocator<spvtools::opt::DominatorTreeNode_*>_>_>
                   ::operator++(&local_b8->iter,0);
        bVar1 = std::function::operator_cast_to_bool((function *)backedge);
        if (bVar1) {
          id = opt::DominatorTreeNode::id(local_c8);
          bVar1 = FindInWorkList((vector<spvtools::CFA<spvtools::opt::DominatorTreeNode>::block_info,_std::allocator<spvtools::CFA<spvtools::opt::DominatorTreeNode>::block_info>_>
                                  *)local_88,id);
          if (bVar1) {
            std::
            function<void_(const_spvtools::opt::DominatorTreeNode_*,_const_spvtools::opt::DominatorTreeNode_*)>
            ::operator()(backedge,local_b8->block,local_c8);
          }
        }
        local_d4 = opt::DominatorTreeNode::id(local_c8);
        sVar4 = std::
                unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                ::count((unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                         *)&work_list.
                            super__Vector_base<spvtools::CFA<spvtools::opt::DominatorTreeNode>::block_info,_std::allocator<spvtools::CFA<spvtools::opt::DominatorTreeNode>::block_info>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage,&local_d4);
        if (sVar4 == 0) {
          std::function<void_(const_spvtools::opt::DominatorTreeNode_*)>::operator()
                    (preorder,local_c8);
          local_e8.block = local_c8;
          pvVar2 = std::
                   function<const_std::vector<spvtools::opt::DominatorTreeNode_*,_std::allocator<spvtools::opt::DominatorTreeNode_*>_>_*(const_spvtools::opt::DominatorTreeNode_*)>
                   ::operator()(successor_func,local_c8);
          local_e8.iter._M_current =
               (DominatorTreeNode **)
               std::
               begin<std::vector<spvtools::opt::DominatorTreeNode*,std::allocator<spvtools::opt::DominatorTreeNode*>>>
                         (pvVar2);
          std::
          vector<spvtools::CFA<spvtools::opt::DominatorTreeNode>::block_info,_std::allocator<spvtools::CFA<spvtools::opt::DominatorTreeNode>::block_info>_>
          ::emplace_back<spvtools::CFA<spvtools::opt::DominatorTreeNode>::block_info>
                    ((vector<spvtools::CFA<spvtools::opt::DominatorTreeNode>::block_info,_std::allocator<spvtools::CFA<spvtools::opt::DominatorTreeNode>::block_info>_>
                      *)local_88,&local_e8);
          local_ec = opt::DominatorTreeNode::id(local_c8);
          std::
          unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
          ::insert((unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                    *)&work_list.
                       super__Vector_base<spvtools::CFA<spvtools::opt::DominatorTreeNode>::block_info,_std::allocator<spvtools::CFA<spvtools::opt::DominatorTreeNode>::block_info>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage,&local_ec);
        }
      }
      else {
        std::function<void_(const_spvtools::opt::DominatorTreeNode_*)>::operator()
                  (postorder,local_b8->block);
        std::
        vector<spvtools::CFA<spvtools::opt::DominatorTreeNode>::block_info,_std::allocator<spvtools::CFA<spvtools::opt::DominatorTreeNode>::block_info>_>
        ::pop_back((vector<spvtools::CFA<spvtools::opt::DominatorTreeNode>::block_info,_std::allocator<spvtools::CFA<spvtools::opt::DominatorTreeNode>::block_info>_>
                    *)local_88);
      }
    }
    std::
    vector<spvtools::CFA<spvtools::opt::DominatorTreeNode>::block_info,_std::allocator<spvtools::CFA<spvtools::opt::DominatorTreeNode>::block_info>_>
    ::~vector((vector<spvtools::CFA<spvtools::opt::DominatorTreeNode>::block_info,_std::allocator<spvtools::CFA<spvtools::opt::DominatorTreeNode>::block_info>_>
               *)local_88);
    std::
    unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
    ::~unordered_set((unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                      *)&work_list.
                         super__Vector_base<spvtools::CFA<spvtools::opt::DominatorTreeNode>::block_info,_std::allocator<spvtools::CFA<spvtools::opt::DominatorTreeNode>::block_info>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage);
    return;
  }
  __assert_fail("terminal && \"The terminal function cannot be empty.\"",
                "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/cfa.h"
                ,0xb9,
                "static void spvtools::CFA<spvtools::opt::DominatorTreeNode>::DepthFirstTraversal(const BB *, get_blocks_func, std::function<void (cbb_ptr)>, std::function<void (cbb_ptr)>, std::function<void (cbb_ptr, cbb_ptr)>, std::function<bool (cbb_ptr)>) [BB = spvtools::opt::DominatorTreeNode]"
               );
}

Assistant:

void CFA<BB>::DepthFirstTraversal(
    const BB* entry, get_blocks_func successor_func,
    std::function<void(cbb_ptr)> preorder,
    std::function<void(cbb_ptr)> postorder,
    std::function<void(cbb_ptr, cbb_ptr)> backedge,
    std::function<bool(cbb_ptr)> terminal) {
  assert(successor_func && "The successor function cannot be empty.");
  assert(preorder && "The preorder function cannot be empty.");
  assert(postorder && "The postorder function cannot be empty.");
  assert(terminal && "The terminal function cannot be empty.");

  std::unordered_set<uint32_t> processed;

  /// NOTE: work_list is the sequence of nodes from the root node to the node
  /// being processed in the traversal
  std::vector<block_info> work_list;
  work_list.reserve(10);

  work_list.push_back({entry, std::begin(*successor_func(entry))});
  preorder(entry);
  processed.insert(entry->id());

  while (!work_list.empty()) {
    block_info& top = work_list.back();
    if (terminal(top.block) || top.iter == end(*successor_func(top.block))) {
      postorder(top.block);
      work_list.pop_back();
    } else {
      BB* child = *top.iter;
      top.iter++;
      if (backedge && FindInWorkList(work_list, child->id())) {
        backedge(top.block, child);
      }
      if (processed.count(child->id()) == 0) {
        preorder(child);
        work_list.emplace_back(
            block_info{child, std::begin(*successor_func(child))});
        processed.insert(child->id());
      }
    }
  }
}